

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRuntimeOptions.h
# Opt level: O0

void setupCommandLineOptions(App *app,HighsCommandLineOptions *cmd_options)

{
  Option *option_name;
  App *this;
  element_type *peVar1;
  long in_RSI;
  App *in_RDI;
  anon_class_1_0_00000001 checkSingle;
  App *in_stack_fffffffffffff138;
  allocator *paVar2;
  Validator *in_stack_fffffffffffff140;
  string *psVar3;
  string *in_stack_fffffffffffff148;
  Option *in_stack_fffffffffffff150;
  FormatterBase *this_00;
  Validator *in_stack_fffffffffffff158;
  Validator *in_stack_fffffffffffff160;
  string *in_stack_fffffffffffff180;
  string *in_stack_fffffffffffff188;
  App *in_stack_fffffffffffff190;
  Validator *in_stack_fffffffffffff198;
  Option *in_stack_fffffffffffff1a0;
  App *flag_name;
  string *in_stack_fffffffffffff248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *variable;
  string *in_stack_fffffffffffff258;
  App *in_stack_fffffffffffff260;
  App *this_01;
  allocator local_bb1;
  string local_bb0 [39];
  undefined1 local_b89 [33];
  undefined1 local_b68 [24];
  string local_b50 [39];
  allocator local_b29;
  string local_b28 [55];
  allocator local_af1;
  string local_af0 [39];
  allocator local_ac9;
  string local_ac8 [55];
  allocator local_a91;
  string local_a90 [39];
  allocator local_a69;
  string local_a68 [55];
  allocator local_a31;
  string local_a30 [39];
  allocator local_a09;
  string local_a08 [71];
  allocator local_9c1;
  string local_9c0 [39];
  allocator local_999;
  string local_998 [39];
  allocator local_971;
  string local_970 [39];
  allocator local_949;
  string local_948 [39];
  allocator local_921;
  string local_920 [32];
  string local_900 [39];
  allocator local_8d9;
  string local_8d8 [32];
  string local_8b8 [39];
  undefined1 local_891 [40];
  undefined1 local_869 [72];
  allocator local_821;
  string local_820 [32];
  string local_800 [39];
  allocator local_7d9;
  string local_7d8 [39];
  allocator local_7b1;
  string local_7b0 [71];
  allocator local_769;
  string local_768 [32];
  string local_748 [39];
  allocator local_721;
  string local_720 [39];
  allocator local_6f9;
  string local_6f8 [71];
  allocator local_6b1;
  string local_6b0 [32];
  string local_690 [39];
  allocator local_669;
  string local_668 [39];
  allocator local_641;
  string local_640 [71];
  allocator local_5f9;
  string local_5f8 [32];
  string local_5d8 [39];
  allocator local_5b1;
  string local_5b0 [32];
  string local_590 [39];
  allocator local_569;
  string local_568 [32];
  string local_548 [39];
  allocator local_521;
  string local_520 [32];
  string local_500 [39];
  allocator local_4d9;
  string local_4d8 [32];
  string local_4b8 [39];
  allocator local_491;
  string local_490 [32];
  string local_470 [39];
  allocator local_449;
  string local_448 [143];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [79];
  allocator local_341;
  string local_340 [32];
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [143];
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [79];
  allocator local_1f1;
  string local_1f0 [32];
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [143];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [79];
  allocator local_a1;
  string local_a0 [48];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  long local_10;
  App *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator+((char *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  std::operator+(in_stack_fffffffffffff148,(char *)in_stack_fffffffffffff140);
  std::operator+(in_stack_fffffffffffff148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"File of model to solve.",&local_a1);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
             in_stack_fffffffffffff248);
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<setupCommandLineOptions(CLI::App&,HighsCommandLineOptions&)::__0,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffff150,(anon_class_1_0_00000001 *)in_stack_fffffffffffff148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"",&local_119);
  CLI::Option::check(in_stack_fffffffffffff150,
                     (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)in_stack_fffffffffffff148,(string *)in_stack_fffffffffffff140,
                     (string *)in_stack_fffffffffffff138);
  CLI::Validator::Validator(in_stack_fffffffffffff160,in_stack_fffffffffffff158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"",&local_1a9);
  CLI::Option::check(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
                     (string *)in_stack_fffffffffffff190);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  CLI::Validator::~Validator(in_stack_fffffffffffff140);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x11b1f6);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::operator+((char *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"File containing HiGHS options.",&local_1f1);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
             in_stack_fffffffffffff248);
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<setupCommandLineOptions(CLI::App&,HighsCommandLineOptions&)::__1,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffff150,(anon_class_1_0_00000001 *)in_stack_fffffffffffff148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"",&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"",&local_269);
  CLI::Option::check(in_stack_fffffffffffff150,
                     (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)in_stack_fffffffffffff148,(string *)in_stack_fffffffffffff140,
                     (string *)in_stack_fffffffffffff138);
  CLI::Validator::Validator(in_stack_fffffffffffff160,in_stack_fffffffffffff158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"",&local_2f9);
  CLI::Option::check(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
                     (string *)in_stack_fffffffffffff190);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  CLI::Validator::~Validator(in_stack_fffffffffffff140);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x11b452);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::__cxx11::string::~string(local_1d0);
  std::operator+((char *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"File of solution to read.",&local_341);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
             in_stack_fffffffffffff248);
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<setupCommandLineOptions(CLI::App&,HighsCommandLineOptions&)::__2,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffff150,(anon_class_1_0_00000001 *)in_stack_fffffffffffff148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"",&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"",&local_3b9);
  CLI::Option::check(in_stack_fffffffffffff150,
                     (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)in_stack_fffffffffffff148,(string *)in_stack_fffffffffffff140,
                     (string *)in_stack_fffffffffffff138);
  CLI::Validator::Validator(in_stack_fffffffffffff160,in_stack_fffffffffffff158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"",&local_449);
  CLI::Option::check(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
                     (string *)in_stack_fffffffffffff190);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  CLI::Validator::~Validator(in_stack_fffffffffffff140);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x11b696);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_320);
  std::operator+((char *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_490,"Set presolve option to:\n\"choose\" * default\n\"on\"\n\"off\"",&local_491);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
             in_stack_fffffffffffff248);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::__cxx11::string::~string(local_470);
  std::operator+((char *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4d8,"Set solver option to:\n\"choose\" * default\n\"simplex\"\n\"ipm\"",
             &local_4d9);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
             in_stack_fffffffffffff248);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  std::__cxx11::string::~string(local_4b8);
  std::operator+((char *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_520,"Set parallel option to:\n\"choose\" * default\n\"on\"\n\"off\"",&local_521);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
             in_stack_fffffffffffff248);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::__cxx11::string::~string(local_500);
  std::operator+((char *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_568,"Set run_crossover option to:\n\"choose\"\n\"on\" * default\n\"off\"",
             &local_569);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
             in_stack_fffffffffffff248);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::__cxx11::string::~string(local_548);
  std::operator+((char *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b0,"Run time limit (seconds - double).",&local_5b1);
  CLI::App::add_option<double,_double,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,(double *)in_stack_fffffffffffff250
             ,in_stack_fffffffffffff248);
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  std::__cxx11::string::~string(local_590);
  std::operator+((char *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f8,"File for writing out model solution.",&local_5f9);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
             in_stack_fffffffffffff248);
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<setupCommandLineOptions(CLI::App&,HighsCommandLineOptions&)::__3_const&,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffff150,(anon_class_1_0_00000001 *)in_stack_fffffffffffff148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_640,"",&local_641);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_668,"",&local_669);
  CLI::Option::check(in_stack_fffffffffffff150,
                     (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)in_stack_fffffffffffff148,(string *)in_stack_fffffffffffff140,
                     (string *)in_stack_fffffffffffff138);
  std::__cxx11::string::~string(local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x11bc0b);
  std::__cxx11::string::~string(local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  std::__cxx11::string::~string(local_5d8);
  std::operator+((char *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b0,"File for initial basis to read.",&local_6b1);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
             in_stack_fffffffffffff248);
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<setupCommandLineOptions(CLI::App&,HighsCommandLineOptions&)::__3_const&,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffff150,(anon_class_1_0_00000001 *)in_stack_fffffffffffff148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f8,"",&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"",&local_721);
  CLI::Option::check(in_stack_fffffffffffff150,
                     (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)in_stack_fffffffffffff148,(string *)in_stack_fffffffffffff140,
                     (string *)in_stack_fffffffffffff138);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x11bdb6);
  std::__cxx11::string::~string(local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  std::__cxx11::string::~string(local_690);
  std::operator+((char *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_768,"File for final basis to write.",&local_769);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
             in_stack_fffffffffffff248);
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<setupCommandLineOptions(CLI::App&,HighsCommandLineOptions&)::__3_const&,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffff150,(anon_class_1_0_00000001 *)in_stack_fffffffffffff148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"",&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7d8,"",&local_7d9);
  CLI::Option::check(in_stack_fffffffffffff150,
                     (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)in_stack_fffffffffffff148,(string *)in_stack_fffffffffffff140,
                     (string *)in_stack_fffffffffffff138);
  std::__cxx11::string::~string(local_7d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x11bf61);
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator((allocator<char> *)&local_769);
  std::__cxx11::string::~string(local_748);
  this_01 = local_8;
  std::operator+((char *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_820,"File for writing out model.",&local_821);
  option_name = CLI::App::
                add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                          (this_01,in_stack_fffffffffffff258,in_stack_fffffffffffff250,
                           in_stack_fffffffffffff248);
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<setupCommandLineOptions(CLI::App&,HighsCommandLineOptions&)::__3_const&,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffff150,(anon_class_1_0_00000001 *)in_stack_fffffffffffff148);
  variable = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_869;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_869 + 1),"",(allocator *)variable);
  psVar3 = (string *)local_891;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_891 + 1),"",(allocator *)psVar3);
  CLI::Option::check(in_stack_fffffffffffff150,
                     (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)in_stack_fffffffffffff148,(string *)in_stack_fffffffffffff140,
                     (string *)in_stack_fffffffffffff138);
  std::__cxx11::string::~string((string *)(local_891 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_891);
  std::__cxx11::string::~string((string *)(local_869 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_869);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x11c10e);
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator((allocator<char> *)&local_821);
  std::__cxx11::string::~string(local_800);
  std::operator+((char *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_8d8,"Seed to initialize random number \ngeneration.",&local_8d9);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (this_01,(string *)option_name,(int *)variable,psVar3);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  std::__cxx11::string::~string(local_8b8);
  flag_name = local_8;
  std::operator+((char *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  this = (App *)(local_10 + 0x178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_920,
             "Compute cost, bound, RHS and basic \nsolution ranging:\n\"on\"\n\"off\" * default",
             &local_921);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (this_01,(string *)option_name,variable,psVar3);
  std::__cxx11::string::~string(local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  std::__cxx11::string::~string(local_900);
  paVar2 = &local_949;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_948,"--version,-v",paVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_970,"Print version.",&local_971);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (this,(string *)flag_name,(bool *)paVar2,(string *)local_8);
  std::__cxx11::string::~string(local_970);
  std::allocator<char>::~allocator((allocator<char> *)&local_971);
  std::__cxx11::string::~string(local_948);
  std::allocator<char>::~allocator((allocator<char> *)&local_949);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_998,"-h,--help",&local_999);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c0,"Print help.",&local_9c1);
  CLI::App::set_help_flag
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  std::__cxx11::string::~string(local_9c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
  std::__cxx11::string::~string(local_998);
  std::allocator<char>::~allocator((allocator<char> *)&local_999);
  CLI::App::get_formatter(in_stack_fffffffffffff138);
  peVar1 = CLI::std::
           __shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x11c48b);
  CLI::FormatterBase::column_width(peVar1,0x21);
  CLI::std::shared_ptr<CLI::FormatterBase>::~shared_ptr((shared_ptr<CLI::FormatterBase> *)0x11c4a7);
  CLI::App::get_formatter(in_stack_fffffffffffff138);
  CLI::std::__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x11c4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a08,"TEXT:FILE",&local_a09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a30,"file",&local_a31);
  CLI::FormatterBase::label
            ((FormatterBase *)in_stack_fffffffffffff150,in_stack_fffffffffffff148,
             (string *)in_stack_fffffffffffff140);
  std::__cxx11::string::~string(local_a30);
  std::allocator<char>::~allocator((allocator<char> *)&local_a31);
  std::__cxx11::string::~string(local_a08);
  std::allocator<char>::~allocator((allocator<char> *)&local_a09);
  CLI::std::shared_ptr<CLI::FormatterBase>::~shared_ptr((shared_ptr<CLI::FormatterBase> *)0x11c59f);
  CLI::App::get_formatter(in_stack_fffffffffffff138);
  CLI::std::__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x11c5c3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a68,"TEXT",&local_a69);
  paVar2 = &local_a91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a90,"text",paVar2);
  CLI::FormatterBase::label
            ((FormatterBase *)in_stack_fffffffffffff150,in_stack_fffffffffffff148,
             (string *)in_stack_fffffffffffff140);
  std::__cxx11::string::~string(local_a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_a91);
  std::__cxx11::string::~string(local_a68);
  std::allocator<char>::~allocator((allocator<char> *)&local_a69);
  CLI::std::shared_ptr<CLI::FormatterBase>::~shared_ptr((shared_ptr<CLI::FormatterBase> *)0x11c67f);
  CLI::App::get_formatter(in_stack_fffffffffffff138);
  CLI::std::__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x11c6a3);
  paVar2 = &local_ac9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac8,"FLOAT",paVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_af0,"float",&local_af1);
  CLI::FormatterBase::label
            ((FormatterBase *)in_stack_fffffffffffff150,in_stack_fffffffffffff148,
             (string *)in_stack_fffffffffffff140);
  std::__cxx11::string::~string(local_af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_af1);
  std::__cxx11::string::~string(local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  CLI::std::shared_ptr<CLI::FormatterBase>::~shared_ptr((shared_ptr<CLI::FormatterBase> *)0x11c75f);
  CLI::App::get_formatter(in_stack_fffffffffffff138);
  CLI::std::__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x11c783);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b28,"INT",&local_b29);
  paVar2 = (allocator *)(local_b68 + 0x17);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b50,"int",paVar2);
  CLI::FormatterBase::label
            ((FormatterBase *)in_stack_fffffffffffff150,in_stack_fffffffffffff148,
             (string *)in_stack_fffffffffffff140);
  std::__cxx11::string::~string(local_b50);
  std::allocator<char>::~allocator((allocator<char> *)(local_b68 + 0x17));
  std::__cxx11::string::~string(local_b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_b29);
  CLI::std::shared_ptr<CLI::FormatterBase>::~shared_ptr((shared_ptr<CLI::FormatterBase> *)0x11c83f);
  psVar3 = (string *)local_b68;
  CLI::App::get_formatter(in_stack_fffffffffffff138);
  peVar1 = CLI::std::
           __shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x11c863);
  this_00 = (FormatterBase *)local_b89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_b89 + 1),"OPTIONS",(allocator *)this_00);
  paVar2 = &local_bb1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bb0,"options",paVar2);
  CLI::FormatterBase::label(this_00,(string *)peVar1,psVar3);
  std::__cxx11::string::~string(local_bb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bb1);
  std::__cxx11::string::~string((string *)(local_b89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b89);
  CLI::std::shared_ptr<CLI::FormatterBase>::~shared_ptr((shared_ptr<CLI::FormatterBase> *)0x11c91d);
  return;
}

Assistant:

void setupCommandLineOptions(CLI::App& app,
                             HighsCommandLineOptions& cmd_options) {
  // Command line file specifications.
  app.add_option("--" + kModelFileString + "," + kModelFileString,
                 cmd_options.model_file, "File of model to solve.")
      // Can't use required here because it breaks version printing with -v.
      // ->required()
      ->check([](const std::string& input) -> std::string {
        // std::cout << "Input is: " << input << std::endl;
        if (input.find(' ') != std::string::npos) {
          return "Multiple files not implemented.";
        }
        return {};
      })
      ->check(CLI::ExistingFile);

  app.add_option("--" + kOptionsFileString, cmd_options.options_file,
                 "File containing HiGHS options.")
      ->check([](const std::string& input) -> std::string {
        if (input.find(' ') != std::string::npos) {
          return "Multiple files not implemented.";
        }
        return {};
      })
      ->check(CLI::ExistingFile);

  app.add_option("--" + kReadSolutionFileString, cmd_options.read_solution_file,
                 "File of solution to read.")
      ->check([](const std::string& input) -> std::string {
        if (input.find(' ') != std::string::npos) {
          return "Multiple files not implemented.";
        }
        return {};
      })
      ->check(CLI::ExistingFile);

  // Command line option specifications.
  app.add_option("--" + kPresolveString, cmd_options.cmd_presolve,
                 "Set presolve option to:\n"
                 "\"choose\" * default\n"
                 "\"on\"\n"
                 "\"off\"");

  app.add_option("--" + kSolverString, cmd_options.cmd_solver,
                 "Set solver option to:\n"
                 "\"choose\" * default\n"
                 "\"simplex\"\n"
                 "\"ipm\"");

  app.add_option("--" + kParallelString, cmd_options.cmd_parallel,
                 "Set parallel option to:\n"
                 "\"choose\" * default\n"
                 "\"on\"\n"
                 "\"off\"");

  app.add_option("--" + kRunCrossoverString, cmd_options.cmd_crossover,
                 "Set run_crossover option to:\n"
                 "\"choose\"\n"
                 "\"on\" * default\n"
                 "\"off\"");

  app.add_option("--" + kTimeLimitString, cmd_options.cmd_time_limit,
                 "Run time limit (seconds - double).");

  const auto checkSingle = [](const std::string& input) -> std::string {
    if (input.find(' ') != std::string::npos) {
      return "Multiple files not implemented.";
    }
    return {};
  };

  app.add_option("--" + kSolutionFileString, cmd_options.cmd_solution_file,
                 "File for writing out model solution.")
      ->check(checkSingle);

  app.add_option("--" + kReadBasisFile, cmd_options.cmd_read_basis_file,
                 "File for initial basis to read.")
      ->check(checkSingle);

  app.add_option("--" + kWriteBasisFile, cmd_options.cmd_write_basis_file,
                 "File for final basis to write.")
      ->check(checkSingle);

  app.add_option("--" + kWriteModelFileString, cmd_options.cmd_write_model_file,
                 "File for writing out model.")
      ->check(checkSingle);

  app.add_option("--" + kRandomSeedString, cmd_options.cmd_random_seed,
                 "Seed to initialize random number \ngeneration.");

  app.add_option("--" + kRangingString, cmd_options.cmd_ranging,
                 "Compute cost, bound, RHS and basic \nsolution ranging:\n"
                 "\"on\"\n"
                 "\"off\" * default");

  // Version.
  app.add_flag("--version,-v", cmd_options.cmd_version, "Print version.");
  app.set_help_flag("-h,--help", "Print help.");

  app.get_formatter()->column_width(33);

  app.get_formatter()->label("TEXT:FILE", "file");
  app.get_formatter()->label("TEXT", "text");
  app.get_formatter()->label("FLOAT", "float");
  app.get_formatter()->label("INT", "int");
  app.get_formatter()->label("OPTIONS", "options");
}